

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseOutputCommand(WastParser *this,CommandPtr *param_1)

{
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  Var local_120;
  undefined1 local_d8 [8];
  string text;
  Var var;
  undefined1 local_48 [8];
  Location loc;
  CommandPtr *param_1_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Output);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  Error(this,0x230dbe);
  Var::Var((Var *)((long)&text.field_2 + 8));
  std::__cxx11::string::string((string *)local_d8);
  Var::Var(&local_120);
  ParseVarOpt(this,(Var *)((long)&text.field_2 + 8),&local_120);
  Var::~Var(&local_120);
  TVar3 = Peek(this,0);
  if (TVar3 == Text) {
    RVar2 = ParseQuotedText(this,(string *)local_d8,true);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_00195819;
    }
  }
  RVar2 = Expect(this,Rpar);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
LAB_00195819:
  std::__cxx11::string::~string((string *)local_d8);
  Var::~Var((Var *)((long)&text.field_2 + 8));
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseOutputCommand(CommandPtr*) {
  // Parse the output command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseOutputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Output);
  Error(loc, "output command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  if (Peek() == TokenType::Text) {
    CHECK_RESULT(ParseQuotedText(&text));
  }
  EXPECT(Rpar);
  return Result::Error;
}